

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat __thiscall Mat::operator~(Mat *this)

{
  double *extraout_RDX;
  double *pdVar1;
  double *in_RSI;
  Mat MVar2;
  int local_24;
  int local_20;
  int j;
  int i;
  Mat *this_local;
  Mat *transpose;
  
  Mat(this,*(int *)((long)in_RSI + 4),*(int *)in_RSI);
  pdVar1 = extraout_RDX;
  for (local_20 = 0; local_20 < *(int *)in_RSI; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < *(int *)((long)in_RSI + 4); local_24 = local_24 + 1) {
      this->v_[local_24 * *(int *)((long)in_RSI + 4) + local_20] =
           *(double *)
            ((long)in_RSI[1] + (long)(local_20 * *(int *)((long)in_RSI + 4) + local_24) * 8);
      pdVar1 = in_RSI;
    }
  }
  MVar2.v_ = pdVar1;
  MVar2._0_8_ = this;
  return MVar2;
}

Assistant:

Mat Mat::operator~()
{
	Mat transpose(n_cols_, n_rows_);
	for (int i=0; i<n_rows_; i++)
		for(int j=0; j<n_cols_; j++)
			transpose.v_[j*n_cols_+i] = v_[i*n_cols_+j];
	return transpose;
}